

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true>::
GetProperty_Internal<false>
          (SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true> *this,
          DynamicObject *instance,Var originalInstance,PropertyId propertyId,Var *value,
          PropertyValueInfo *info,ScriptContext *requestContext)

{
  PropertyAttributes PVar1;
  PropertyIndex PVar2;
  code *pcVar3;
  bool bVar4;
  uint32 index;
  BOOL BVar5;
  undefined4 *puVar6;
  Var pvVar7;
  RecyclableObject *pRVar8;
  int local_54;
  SimpleDictionaryPropertyDescriptor<unsigned_short> *pSStack_50;
  int i;
  SimpleDictionaryPropertyDescriptor<unsigned_short> *descriptor;
  PropertyRecord *propertyRecord;
  PropertyValueInfo *local_38;
  
  propertyRecord = (PropertyRecord *)originalInstance;
  local_38 = info;
  if (propertyId == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x492,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  descriptor = (SimpleDictionaryPropertyDescriptor<unsigned_short> *)
               ScriptContext::GetPropertyName
                         ((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)
                          ->super_JavascriptLibraryBase).scriptContext.ptr,propertyId);
  bVar4 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
                      *)(this->propertyMap).ptr,(PropertyRecord **)&descriptor,
                     &stack0xffffffffffffffb0,&local_54);
  if (bVar4) {
    BVar5 = 0;
    if ((pSStack_50->Attributes & 0x18) == 0) {
      if (pSStack_50->propertyIndex == 0xffff) {
        *value = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                 super_JavascriptLibraryBase).undefinedValue.ptr;
        BVar5 = 1;
      }
      else {
        pvVar7 = DynamicObject::GetSlot(instance,(uint)pSStack_50->propertyIndex);
        *value = pvVar7;
        BVar5 = 1;
        if (local_38 != (PropertyValueInfo *)0x0) {
          PVar1 = pSStack_50->Attributes;
          PVar2 = pSStack_50->propertyIndex;
          local_38->m_instance = &instance->super_RecyclableObject;
          local_38->m_propertyIndex = PVar2;
          local_38->m_attributes = PVar1;
          local_38->flags = InlineCacheNoFlags;
          if (((uint)*pSStack_50 & 6) != 2) {
            *(undefined1 *)&local_38->cacheInfoFlag = (char)local_38->cacheInfoFlag & 0xfb;
          }
        }
      }
    }
  }
  else {
    bVar4 = DynamicObject::HasObjectArray(instance);
    if ((bVar4) && (*(char *)(descriptor + 4) == '\x01')) {
      index = PropertyRecord::GetNumericValue((PropertyRecord *)descriptor);
      BVar5 = DynamicTypeHandler::GetItem
                        (&this->super_DynamicTypeHandler,instance,propertyRecord,index,value,
                         requestContext);
    }
    else {
      pRVar8 = ScriptContext::GetMissingPropertyResult(requestContext);
      *value = pRVar8;
      BVar5 = 0;
    }
  }
  return BVar5;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::GetProperty_Internal(DynamicObject* instance, Var originalInstance, PropertyId propertyId, Var* value, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor;
        Assert(propertyId != Constants::NoProperty);
        PropertyRecord const* propertyRecord = instance->GetScriptContext()->GetPropertyName(propertyId);
        if (propertyMap->TryGetReference(propertyRecord, &descriptor))
        {
            return GetPropertyFromDescriptor<allowLetConstGlobal>(instance, descriptor, value, info);
        }

        // Check numeric propertyRecord only if objectArray available
        if (instance->HasObjectArray() && propertyRecord->IsNumeric())
        {
            return SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::GetItem(instance, originalInstance, propertyRecord->GetNumericValue(), value, requestContext);
        }

        *value = requestContext->GetMissingPropertyResult();
        return false;
    }